

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_gc(lua_State *L,int what,int data)

{
  uint64_t uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = 0xffffffff;
  if (9 < (uint)what) {
    return -1;
  }
  uVar1 = (L->glref).ptr64;
  switch(what) {
  case 0:
    uVar4 = 0x800000000000;
    goto LAB_0011b7a9;
  case 1:
    uVar4 = *(ulong *)(uVar1 + 0x10);
    if (data == -1) {
      uVar4 = (ulong)*(uint *)(uVar1 + 0x6c) * (uVar4 / 100);
    }
LAB_0011b7a9:
    *(ulong *)(uVar1 + 0x18) = uVar4;
LAB_0011b7ad:
    uVar5 = 0;
    break;
  case 2:
    lj_gc_fullgc(L);
    goto LAB_0011b7ad;
  case 3:
    uVar5 = (uint)(*(ulong *)(uVar1 + 0x10) >> 10);
    break;
  case 4:
    uVar5 = *(uint *)(uVar1 + 0x10) & 0x3ff;
    break;
  case 5:
    lVar3 = 0;
    if ((ulong)((long)data * 0x400) <= *(ulong *)(uVar1 + 0x10)) {
      lVar3 = *(ulong *)(uVar1 + 0x10) + (long)data * -0x400;
    }
    *(long *)(uVar1 + 0x18) = lVar3;
    do {
      if (*(ulong *)(uVar1 + 0x10) < *(ulong *)(uVar1 + 0x18)) {
        return 0;
      }
      iVar2 = lj_gc_step(L);
    } while (iVar2 < 1);
    uVar5 = 1;
    break;
  case 6:
    uVar5 = *(uint *)(uVar1 + 0x6c);
    *(int *)(uVar1 + 0x6c) = data;
    break;
  case 7:
    uVar5 = *(uint *)(uVar1 + 0x68);
    *(int *)(uVar1 + 0x68) = data;
    break;
  case 9:
    uVar5 = (uint)(*(long *)(uVar1 + 0x18) != 0x800000000000);
  }
  return uVar5;
}

Assistant:

LUA_API int lua_gc(lua_State *L, int what, int data)
{
  global_State *g = G(L);
  int res = 0;
  switch (what) {
  case LUA_GCSTOP:
    g->gc.threshold = LJ_MAX_MEM;
    break;
  case LUA_GCRESTART:
    g->gc.threshold = data == -1 ? (g->gc.total/100)*g->gc.pause : g->gc.total;
    break;
  case LUA_GCCOLLECT:
    lj_gc_fullgc(L);
    break;
  case LUA_GCCOUNT:
    res = (int)(g->gc.total >> 10);
    break;
  case LUA_GCCOUNTB:
    res = (int)(g->gc.total & 0x3ff);
    break;
  case LUA_GCSTEP: {
    GCSize a = (GCSize)data << 10;
    g->gc.threshold = (a <= g->gc.total) ? (g->gc.total - a) : 0;
    while (g->gc.total >= g->gc.threshold)
      if (lj_gc_step(L) > 0) {
	res = 1;
	break;
      }
    break;
  }
  case LUA_GCSETPAUSE:
    res = (int)(g->gc.pause);
    g->gc.pause = (MSize)data;
    break;
  case LUA_GCSETSTEPMUL:
    res = (int)(g->gc.stepmul);
    g->gc.stepmul = (MSize)data;
    break;
  case LUA_GCISRUNNING:
    res = (g->gc.threshold != LJ_MAX_MEM);
    break;
  default:
    res = -1;  /* Invalid option. */
  }
  return res;
}